

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecComparison(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  bool local_8a;
  unique_ptr<enact::BinaryExpr,_std::default_delete<enact::BinaryExpr>_> local_70;
  undefined1 local_68 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> rightExpr;
  Token oper;
  Parser *this_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr;
  
  parsePrecCast(this);
  while( true ) {
    bVar1 = consume(in_RSI,LESS);
    local_8a = true;
    if (!bVar1) {
      bVar1 = consume(in_RSI,LESS_EQUAL);
      local_8a = true;
      if (!bVar1) {
        bVar1 = consume(in_RSI,GREATER);
        local_8a = true;
        if (!bVar1) {
          local_8a = consume(in_RSI,GREATER_EQUAL);
        }
      }
    }
    if (local_8a == false) break;
    Token::Token((Token *)&rightExpr,&in_RSI->m_previous);
    parsePrecCast((Parser *)local_68);
    std::
    make_unique<enact::BinaryExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_70,
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)this,(Token *)local_68)
    ;
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_70);
    std::unique_ptr<enact::BinaryExpr,_std::default_delete<enact::BinaryExpr>_>::~unique_ptr
              (&local_70);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_68);
    Token::~Token((Token *)&rightExpr);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecComparison() {
        std::unique_ptr<Expr> expr = parsePrecCast();

        while (consume(TokenType::LESS) ||
               consume(TokenType::LESS_EQUAL) ||
               consume(TokenType::GREATER) ||
               consume(TokenType::GREATER_EQUAL)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecCast();
            expr = std::make_unique<BinaryExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }